

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O1

bool node::DumpMempool(CTxMemPool *pool,path *dump_path,FopenFn mockable_fopen_function,
                      bool skip_file_commit)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  mapped_type_conflict1 mVar4;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  path src;
  path dest;
  pointer pTVar5;
  bool bVar6;
  value_type *__val;
  _Impl *p_Var7;
  mapped_type_conflict1 *pmVar8;
  _Base_ptr p_Var9;
  FILE *pFVar10;
  pointer __dest;
  long lVar11;
  runtime_error *this;
  undefined4 in_ECX;
  undefined1 *puVar12;
  char *__n;
  undefined7 in_register_00000011;
  size_t __n_00;
  int __fd;
  TxMempoolInfo *i;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>_>
  pVar13;
  Span<std::byte> output;
  undefined8 in_stack_fffffffffffffd38;
  _Impl *p_Var14;
  undefined4 in_stack_fffffffffffffd48;
  path *__p;
  path *ppVar15;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var16;
  unsigned_long local_2a0;
  double local_298;
  uint64_t mempool_transactions_to_write;
  vector<std::byte,_std::allocator<std::byte>_> local_288;
  void *local_268;
  undefined8 uStack_260;
  long local_258;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> local_248;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  AutoFile file;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  path local_1c0;
  path local_198;
  path local_170;
  undefined1 local_148 [8];
  undefined1 auStack_140 [8];
  undefined1 local_138 [24];
  FILE *local_120;
  path local_c0;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_98;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  
  lVar11 = CONCAT71(in_register_00000011,skip_file_commit);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var7 = (_Impl *)std::chrono::_V2::steady_clock::now();
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = &local_98._M_impl.super__Rb_tree_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
      ::dump_mutex == '\0') goto LAB_00265e90;
  while( true ) {
    criticalblock8.super_unique_lock._M_device = &DumpMempool::dump_mutex.super_mutex;
    criticalblock8.super_unique_lock._M_owns = false;
    std::unique_lock<std::mutex>::lock(&criticalblock8.super_unique_lock);
    criticalblock9.super_unique_lock._M_device = &(pool->cs).super_recursive_mutex;
    criticalblock9.super_unique_lock._8_8_ =
         criticalblock9.super_unique_lock._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock9.super_unique_lock);
    p_Var9 = (pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header;
    _Var16._M_head_impl = p_Var7;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        mVar4 = *(mapped_type_conflict1 *)(p_Var9 + 2);
        pmVar8 = std::
                 map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                 ::operator[](&mapDeltas,(key_type *)(p_Var9 + 1));
        *pmVar8 = mVar4;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    CTxMemPool::infoAll((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)&file,pool);
    local_138._0_8_ =
         local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    auStack_140 = (undefined1  [8])
                  local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_148 = (undefined1  [8])
                local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)file.m_file;
    local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    file.m_file = (FILE *)0x0;
    file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
              ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)local_148);
    std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
              ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)&file);
    CTxMemPool::GetUnbroadcastTxs
              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)local_148,pool);
    __p = &dump_path->super_path;
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::clear(&local_98);
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = auStack_140._0_4_;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_138._0_8_;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_138._8_8_;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_138._16_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138._0_8_ + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
      local_98._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_120;
      local_138._0_8_ = (pointer)0x0;
      local_120 = (FILE *)0x0;
      local_138._8_8_ = (_Base_ptr)auStack_140;
      local_138._16_8_ = (_Base_ptr)auStack_140;
    }
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                 *)local_148);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock9.super_unique_lock);
    p_Var7 = (_Impl *)std::chrono::_V2::steady_clock::now();
    std::filesystem::__cxx11::path::path(&local_c0,&dump_path->super_path);
    std::filesystem::__cxx11::path::_M_concat(&local_c0,4,".new");
    std::filesystem::__cxx11::path::path((path *)local_148,&local_c0);
    criticalblock9.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_63f024;
    if (*(long *)(lVar11 + 0x10) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        std::__throw_bad_function_call();
        goto LAB_00265eb6;
      }
      goto LAB_002661cf;
    }
    pFVar10 = (FILE *)(**(code **)(lVar11 + 0x18))(lVar11,local_148,&criticalblock9);
    local_268 = (void *)0x0;
    uStack_260 = 0;
    local_258 = 0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)lVar11;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd38;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffd48;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = in_ECX;
    AutoFile::AutoFile(&file,pFVar10,data_xor);
    if (local_268 != (void *)0x0) {
      operator_delete(local_268,local_258 - (long)local_268);
    }
    std::filesystem::__cxx11::path::~path((path *)local_148);
    std::filesystem::__cxx11::path::~path(&local_c0);
    if (file.m_file == (FILE *)0x0) {
      bVar6 = false;
      goto LAB_00266167;
    }
    local_148 = (undefined1  [8])(2 - (ulong)(pool->m_opts).persist_v1_dat);
    AutoFile::write(&file,(int)local_148,&DAT_00000008,(size_t)local_148);
    criticalblock9.super_unique_lock._M_device = (mutex_type *)0x0;
    criticalblock9.super_unique_lock._M_owns = false;
    criticalblock9.super_unique_lock._9_7_ = 0;
    criticalblock9.super_unique_lock._M_device = (mutex_type *)operator_new(8);
    puVar12 = (undefined1 *)
              ((long)&((criticalblock9.super_unique_lock._M_device)->super___recursive_mutex_base).
                      _M_mutex + 8);
    ((criticalblock9.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.__align =
         0;
    criticalblock9.super_unique_lock._8_8_ = puVar12;
    if ((pool->m_opts).persist_v1_dat == false) {
      FastRandomContext::FastRandomContext((FastRandomContext *)local_148,false);
      output.m_size =
           criticalblock9.super_unique_lock._8_8_ - (long)criticalblock9.super_unique_lock._M_device
      ;
      output.m_data = (byte *)criticalblock9.super_unique_lock._M_device;
      FastRandomContext::fillrand((FastRandomContext *)local_148,output);
      ChaCha20::~ChaCha20((ChaCha20 *)local_138);
      AutoFile::operator<<(&file,(vector<std::byte,_std::allocator<std::byte>_> *)&criticalblock9);
    }
    local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dump_path = (path *)(criticalblock9.super_unique_lock._8_8_ -
                        (long)criticalblock9.super_unique_lock._M_device);
    if ((path *)dump_path == (path *)0x0) break;
    if (-1 < (long)dump_path) {
      __dest = (pointer)operator_new((ulong)dump_path);
      goto LAB_00265ace;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) goto LAB_002661cf;
    std::__throw_bad_alloc();
LAB_00265e90:
    DumpMempool();
  }
  __dest = (pointer)0x0;
LAB_00265ace:
  local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __dest + (long)&((path *)dump_path)->_M_pathname;
  __n_00 = criticalblock9.super_unique_lock._8_8_ - (long)criticalblock9.super_unique_lock._M_device
  ;
  local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = __dest;
  if (__n_00 != 0) {
    local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest;
    memmove(__dest,criticalblock9.super_unique_lock._M_device,__n_00);
  }
  local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + __n_00;
  std::vector<std::byte,_std::allocator<std::byte>_>::operator=(&file.m_xor,&local_288);
  if (local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  mempool_transactions_to_write =
       ((long)local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
              super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  local_148 = (undefined1  [8])mempool_transactions_to_write;
  AutoFile::write(&file,(int)local_148,&DAT_00000008,mempool_transactions_to_write);
  logging_function._M_str = "DumpMempool";
  logging_function._M_len = 0xb;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
  ;
  source_file._M_len = 0x68;
  __n = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
  ;
  LogPrintFormatInternal<unsigned_long>
            (logging_function,source_file,0xbd,ALL,Info,(ConstevalFormatString<1U>)0x805426,
             &mempool_transactions_to_write);
  pTVar5 = local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar10 = (FILE *)local_248.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    do {
      local_148 = (undefined1  [8])&::TX_WITH_WITNESS;
      auStack_140 = (undefined1  [8])&file;
      SerializeTransaction<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
                (*(CTransaction **)pFVar10,
                 (ParamsStream<AutoFile_&,_TransactionSerParams> *)local_148,&::TX_WITH_WITNESS);
      local_148 = (undefined1  [8])pFVar10->_IO_read_end;
      __fd = (int)(ParamsStream<AutoFile_&,_TransactionSerParams> *)local_148;
      AutoFile::write(&file,__fd,&DAT_00000008,(size_t)__n);
      local_148 = (undefined1  [8])pFVar10->_IO_write_ptr;
      AutoFile::write((AutoFile *)&file,__fd,&DAT_00000008,(size_t)__n);
      pVar13 = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               ::equal_range(&mapDeltas._M_t,(key_type *)(*(long *)pFVar10 + 0x39));
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::_M_erase_aux(&mapDeltas._M_t,(_Base_ptr)pVar13.first._M_node,
                     (_Base_ptr)pVar13.second._M_node);
      pFVar10 = (FILE *)&pFVar10->_IO_write_end;
    } while (pFVar10 != (FILE *)pTVar5);
  }
  Serialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
            (&file,&mapDeltas);
  local_148 = (undefined1  [8])local_98._M_impl.super__Rb_tree_header._M_node_count;
  logging_function_00._M_str = "DumpMempool";
  logging_function_00._M_len = 0xb;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
  ;
  source_file_00._M_len = 0x68;
  p_Var14 = p_Var7;
  ppVar15 = __p;
  LogPrintFormatInternal<unsigned_long>
            (logging_function_00,source_file_00,199,ALL,Info,(ConstevalFormatString<1U>)0x805452,
             (unsigned_long *)local_148);
  Serialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
            (&file,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_98);
  if ((char)in_ECX == '\0') {
    bVar6 = AutoFile::Commit(&file);
    if (bVar6) goto LAB_00265d0e;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Commit failed");
  }
  else {
LAB_00265d0e:
    pFVar10 = file.m_file;
    file.m_file = (FILE *)0x0;
    if (pFVar10 != (FILE *)0x0) {
      fclose((FILE *)pFVar10);
    }
    std::filesystem::__cxx11::path::path(&local_198,__p);
    std::filesystem::__cxx11::path::_M_concat(&local_198,4,".new");
    std::filesystem::__cxx11::path::path(&local_170,&local_198);
    std::filesystem::__cxx11::path::path(&local_1c0,__p);
    src.super_path._M_pathname._M_string_length = (size_type)p_Var14;
    src.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd38;
    src.super_path._M_pathname.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd48;
    src.super_path._M_pathname.field_2._M_allocated_capacity._4_4_ = in_ECX;
    src.super_path._M_pathname.field_2._8_8_ = ppVar15;
    src.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )_Var16._M_head_impl;
    dest.super_path._M_pathname._M_string_length = (size_type)local_298;
    dest.super_path._M_pathname._M_dataplus._M_p = (pointer)local_2a0;
    dest.super_path._M_pathname.field_2._M_allocated_capacity = mempool_transactions_to_write;
    dest.super_path._M_pathname.field_2._8_8_ =
         local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    dest.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar6 = RenameOver(src,dest);
    std::filesystem::__cxx11::path::~path(&local_1c0);
    std::filesystem::__cxx11::path::~path(&local_170);
    std::filesystem::__cxx11::path::~path(&local_198);
    if (bVar6) {
      lVar11 = std::chrono::_V2::steady_clock::now();
      local_148 = (undefined1  [8])
                  ((double)((long)p_Var7 - (long)_Var16._M_head_impl) / 1000000000.0);
      local_298 = (double)(lVar11 - (long)p_Var7) / 1000000000.0;
      local_2a0 = std::filesystem::file_size((path *)__p);
      logging_function_01._M_str = "DumpMempool";
      logging_function_01._M_len = 0xb;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      source_file_01._M_len = 0x68;
      LogPrintFormatInternal<double,double,unsigned_long>
                (logging_function_01,source_file_01,0xd5,ALL,Info,
                 (ConstevalFormatString<3U>)0x80549c,(double *)local_148,&local_298,&local_2a0);
      if (criticalblock9.super_unique_lock._M_device != (mutex_type *)0x0) {
        operator_delete(criticalblock9.super_unique_lock._M_device,
                        (long)puVar12 - (long)criticalblock9.super_unique_lock._M_device);
      }
      bVar6 = true;
LAB_00266167:
      AutoFile::~AutoFile(&file);
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock8.super_unique_lock);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&local_98);
      std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector(&local_248);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::~_Rb_tree(&mapDeltas._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        return bVar6;
      }
      goto LAB_002661cf;
    }
LAB_00265eb6:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Rename failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_002661cf:
  __stack_chk_fail();
}

Assistant:

bool DumpMempool(const CTxMemPool& pool, const fs::path& dump_path, FopenFn mockable_fopen_function, bool skip_file_commit)
{
    auto start = SteadyClock::now();

    std::map<uint256, CAmount> mapDeltas;
    std::vector<TxMempoolInfo> vinfo;
    std::set<uint256> unbroadcast_txids;

    static Mutex dump_mutex;
    LOCK(dump_mutex);

    {
        LOCK(pool.cs);
        for (const auto &i : pool.mapDeltas) {
            mapDeltas[i.first] = i.second;
        }
        vinfo = pool.infoAll();
        unbroadcast_txids = pool.GetUnbroadcastTxs();
    }

    auto mid = SteadyClock::now();

    AutoFile file{mockable_fopen_function(dump_path + ".new", "wb")};
    if (file.IsNull()) {
        return false;
    }

    try {
        const uint64_t version{pool.m_opts.persist_v1_dat ? MEMPOOL_DUMP_VERSION_NO_XOR_KEY : MEMPOOL_DUMP_VERSION};
        file << version;

        std::vector<std::byte> xor_key(8);
        if (!pool.m_opts.persist_v1_dat) {
            FastRandomContext{}.fillrand(xor_key);
            file << xor_key;
        }
        file.SetXor(xor_key);

        uint64_t mempool_transactions_to_write(vinfo.size());
        file << mempool_transactions_to_write;
        LogInfo("Writing %u mempool transactions to file...\n", mempool_transactions_to_write);
        for (const auto& i : vinfo) {
            file << TX_WITH_WITNESS(*(i.tx));
            file << int64_t{count_seconds(i.m_time)};
            file << int64_t{i.nFeeDelta};
            mapDeltas.erase(i.tx->GetHash());
        }

        file << mapDeltas;

        LogInfo("Writing %d unbroadcast transactions to file.\n", unbroadcast_txids.size());
        file << unbroadcast_txids;

        if (!skip_file_commit && !file.Commit())
            throw std::runtime_error("Commit failed");
        file.fclose();
        if (!RenameOver(dump_path + ".new", dump_path)) {
            throw std::runtime_error("Rename failed");
        }
        auto last = SteadyClock::now();

        LogInfo("Dumped mempool: %.3fs to copy, %.3fs to dump, %d bytes dumped to file\n",
                  Ticks<SecondsDouble>(mid - start),
                  Ticks<SecondsDouble>(last - mid),
                  fs::file_size(dump_path));
    } catch (const std::exception& e) {
        LogInfo("Failed to dump mempool: %s. Continuing anyway.\n", e.what());
        return false;
    }
    return true;
}